

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void prune_dead_connections(Curl_easy *data)

{
  time_t tVar1;
  timeval newer;
  
  newer = curlx_tvnow();
  tVar1 = curlx_tvdiff(newer,((data->state).conn_cache)->last_cleanup);
  if (999 < tVar1) {
    Curl_conncache_foreach((data->state).conn_cache,data,call_disconnect_if_dead);
    ((data->state).conn_cache)->last_cleanup = newer;
  }
  return;
}

Assistant:

static void prune_dead_connections(struct Curl_easy *data)
{
  struct timeval now = Curl_tvnow();
  time_t elapsed = Curl_tvdiff(now, data->state.conn_cache->last_cleanup);

  if(elapsed >= 1000L) {
    Curl_conncache_foreach(data->state.conn_cache, data,
                           call_disconnect_if_dead);
    data->state.conn_cache->last_cleanup = now;
  }
}